

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestGenericHandler::StartLogFile
          (cmCTestGenericHandler *this,char *name,cmGeneratedFileStream *xofs)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  allocator<char> local_339;
  string local_338;
  ostringstream cmCTestLog_msg_1;
  size_type local_310;
  ostringstream ostr;
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,"Cannot create log file without providing the name");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x74,_cmCTestLog_msg_1,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
    bVar2 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,"Last");
    std::operator<<(poVar3,name);
    if (0 < this->SubmitIndex) {
      poVar3 = std::operator<<((ostream *)&ostr,"_");
      std::ostream::operator<<(poVar3,this->SubmitIndex);
    }
    cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,this->CTest);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    if (local_310 != 0) {
      poVar3 = std::operator<<((ostream *)&ostr,"_");
      cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,this->CTest);
      std::operator<<(poVar3,(string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    }
    std::operator<<((ostream *)&ostr,".log");
    pcVar1 = this->CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg_1,"Temporary",&local_339);
    std::__cxx11::stringbuf::str();
    bVar2 = cmCTest::OpenOutputFile(pcVar1,(string *)&cmCTestLog_msg_1,&local_338,xofs,false);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Cannot create log file: ");
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<(poVar3,(string *)&local_338);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_338);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0x82,local_338._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  }
  return bVar2;
}

Assistant:

bool cmCTestGenericHandler::StartLogFile(const char* name,
                                         cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << "Last" << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  if (!this->CTest->GetCurrentTag().empty()) {
    ostr << "_" << this->CTest->GetCurrentTag();
  }
  ostr << ".log";
  if (!this->CTest->OpenOutputFile("Temporary", ostr.str(), xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: " << ostr.str() << std::endl);
    return false;
  }
  return true;
}